

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::AlpsNewCodepointTest_Enabled_Test::TestBody
          (AlpsNewCodepointTest_Enabled_Test *this)

{
  UniquePtr<SSL> *out_client;
  internal iVar1;
  int iVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  SSL_CTX_set_select_certificate_cb
            ((this->super_AlpsNewCodepointTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
             anon_func::anon_class_1_0_00000001::__invoke);
  out_client = &(this->super_AlpsNewCodepointTest).client_;
  iVar1 = (internal)
          CreateClientAndServer
                    (out_client,&(this->super_AlpsNewCodepointTest).server_,
                     (this->super_AlpsNewCodepointTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_AlpsNewCodepointTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50[0] = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,
               (AssertionResult *)
               "CreateClientAndServer(&client_, &server_, client_ctx_.get(), server_ctx_.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x22bf,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  if ((bool)iVar1) {
    SSL_set_alps_use_new_codepoint
              ((this->super_AlpsNewCodepointTest).client_._M_t.
               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    SSL_set_alps_use_new_codepoint
              ((this->super_AlpsNewCodepointTest).server_._M_t.
               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    AlpsNewCodepointTest::SetUpApplicationSetting(&this->super_AlpsNewCodepointTest);
    iVar1 = (internal)
            CompleteHandshakes((this->super_AlpsNewCodepointTest).client_._M_t.
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                               (this->super_AlpsNewCodepointTest).server_._M_t.
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_50[0] = iVar1;
    if (!(bool)iVar1) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_50,
                 (AssertionResult *)"CompleteHandshakes(client_.get(), server_.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x22c5,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    if ((bool)iVar1) {
      iVar2 = SSL_has_application_settings
                        ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_50[0] = (internal)(iVar2 != 0);
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_50[0]) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,local_50,
                   (AssertionResult *)"SSL_has_application_settings(client_.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x22c6,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
    }
  }
  return;
}

Assistant:

TEST_F(AlpsNewCodepointTest, Enabled) {
  SetUpExpectedNewCodePoint(server_ctx_.get());

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  SSL_set_alps_use_new_codepoint(client_.get(), 1);
  SSL_set_alps_use_new_codepoint(server_.get(), 1);

  SetUpApplicationSetting();
  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));
  ASSERT_TRUE(SSL_has_application_settings(client_.get()));
}